

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

size_t searchCodeIndex(uint *array,size_t array_size,size_t value)

{
  ulong uVar1;
  size_t mid;
  size_t right;
  size_t left;
  size_t value_local;
  size_t array_size_local;
  uint *array_local;
  
  right = 1;
  mid = array_size - 1;
  while( true ) {
    while( true ) {
      if (mid < right) {
        return array_size - 1;
      }
      uVar1 = right + mid >> 1;
      if (value < array[uVar1]) break;
      right = uVar1 + 1;
    }
    if (array[uVar1 - 1] <= value) break;
    mid = uVar1 - 1;
  }
  return uVar1 - 1;
}

Assistant:

static size_t searchCodeIndex(const unsigned* array, size_t array_size, size_t value)
{
  /*linear search implementation*/
  /*for(size_t i = 1; i < array_size; ++i) if(array[i] > value) return i - 1;
  return array_size - 1;*/

  /*binary search implementation (not that much faster) (precondition: array_size > 0)*/
  size_t left  = 1;
  size_t right = array_size - 1;
  while(left <= right)
  {
    size_t mid = (left + right) / 2;
    if(array[mid] <= value) left = mid + 1; /*the value to find is more to the right*/
    else if(array[mid - 1] > value) right = mid - 1; /*the value to find is more to the left*/
    else return mid - 1;
  }
  return array_size - 1;
}